

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTextureParam
               (ContextType *contextType,GLenum pname)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    bVar1 = es30::isCoreTextureParam(pname);
    bVar1 = pname == 0x90ea || bVar1;
    bVar2 = pname == 0x1004;
  }
  else {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (!bVar1) {
      bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
      if (!bVar1) {
        return false;
      }
      bVar1 = es30::isCoreTextureParam(pname);
      return bVar1;
    }
    bVar1 = es30::isCoreTextureParam(pname);
    bVar2 = pname == 0x90ea;
  }
  return (bool)(bVar2 | bVar1);
}

Assistant:

static bool isCoreTextureParam (const glu::ContextType& contextType, glw::GLenum pname)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTextureParam(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTextureParam(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTextureParam(pname);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}